

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O1

int stbtt_GetGlyphShape(stbtt_fontinfo *info,int glyph_index,stbtt_vertex **pvertices)

{
  ushort *puVar1;
  byte bVar2;
  short sVar3;
  uchar *puVar4;
  bool bVar5;
  int cx;
  int cy;
  ushort uVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  int num_vertices;
  int iVar10;
  ulong uVar11;
  stbtt_vertex *vertices;
  ushort *puVar12;
  stbtt_vertex *psVar13;
  ulong uVar14;
  short sVar15;
  int was_off;
  stbtt_int32 cx_00;
  stbtt_int32 sVar16;
  int iVar17;
  long lVar18;
  long lVar19;
  byte bVar20;
  short sVar21;
  int sx;
  byte bVar22;
  int sy;
  ushort uVar23;
  stbtt_int32 cy_00;
  stbtt_int32 sVar24;
  ulong uVar25;
  int iVar26;
  uint start_off;
  ushort *puVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  ulong local_d8;
  stbtt__csctx count_ctx;
  stbtt__csctx local_68;
  
  if ((info->cff).size != 0) {
    count_ctx.first_x = 0.0;
    count_ctx.first_y = 0.0;
    count_ctx.min_y = 0;
    count_ctx.max_y = 0;
    count_ctx.pvertices = (stbtt_vertex *)0x0;
    count_ctx.x = 0.0;
    count_ctx.y = 0.0;
    count_ctx.min_x = 0;
    count_ctx.max_x = 0;
    count_ctx.num_vertices = 0;
    count_ctx._52_4_ = 0;
    count_ctx.bounds = 1;
    count_ctx.started = 0;
    local_68.num_vertices = 0;
    local_68._52_4_ = 0;
    local_68.min_y = 0;
    local_68.max_y = 0;
    local_68.pvertices = (stbtt_vertex *)0x0;
    local_68.x = 0.0;
    local_68.y = 0.0;
    local_68.min_x = 0;
    local_68.max_x = 0;
    local_68.bounds = 0;
    local_68.started = 0;
    local_68.first_x = 0.0;
    local_68.first_y = 0.0;
    iVar7 = stbtt__run_charstring(info,glyph_index,&count_ctx);
    if (iVar7 != 0) {
      iVar7 = count_ctx.num_vertices;
      local_68.pvertices = (stbtt_vertex *)ImGui::MemAlloc((long)count_ctx.num_vertices * 0xe);
      *pvertices = local_68.pvertices;
      iVar8 = stbtt__run_charstring(info,glyph_index,&local_68);
      if (iVar8 != 0) {
        if (local_68.num_vertices == iVar7) {
          return local_68.num_vertices;
        }
        __assert_fail("output_ctx.num_vertices == count_ctx.num_vertices",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/include/imstb_truetype.h"
                      ,0x8c6,
                      "int stbtt__GetGlyphShapeT2(const stbtt_fontinfo *, int, stbtt_vertex **)");
      }
    }
    *pvertices = (stbtt_vertex *)0x0;
    return 0;
  }
  puVar4 = info->data;
  uVar9 = stbtt__GetGlyfOffset(info,glyph_index);
  *pvertices = (stbtt_vertex *)0x0;
  if ((int)uVar9 < 0) {
LAB_0015aa73:
    local_d8._0_4_ = 0;
  }
  else {
    uVar11 = (ulong)uVar9;
    uVar6 = CONCAT11(puVar4[uVar11],puVar4[uVar11 + 1]);
    if ((short)uVar6 < 1) {
      if (uVar6 == 0xffff) {
        local_d8 = 0;
        vertices = (stbtt_vertex *)0x0;
        puVar12 = (ushort *)(puVar4 + uVar11 + 10);
        bVar20 = 1;
        do {
          bVar22 = bVar20;
          if (bVar22 == 0) break;
          count_ctx.bounds = 0;
          count_ctx.started = 0;
          bVar20 = *(byte *)((long)puVar12 + 1);
          if ((bVar20 & 2) == 0) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/include/imstb_truetype.h"
                          ,0x70b,
                          "int stbtt__GetGlyphShapeTT(const stbtt_fontinfo *, int, stbtt_vertex **)"
                         );
          }
          if ((bVar20 & 1) == 0) {
            iVar7 = (int)(char)puVar12[2];
            iVar8 = (int)*(char *)((long)puVar12 + 5);
            lVar18 = 6;
          }
          else {
            iVar7 = (int)CONCAT11((char)puVar12[2],*(undefined1 *)((long)puVar12 + 5));
            iVar8 = (int)(short)(puVar12[3] << 8 | puVar12[3] >> 8);
            lVar18 = 8;
          }
          puVar27 = (ushort *)(lVar18 + (long)puVar12);
          if ((bVar20 & 8) == 0) {
            if ((bVar20 & 0x40) == 0) {
              fVar33 = 0.0;
              if ((char)bVar20 < '\0') {
                fVar32 = (float)(int)(short)(*puVar27 << 8 | *puVar27 >> 8) * 6.1035156e-05;
                puVar1 = puVar27 + 3;
                fVar35 = (float)(int)(short)(puVar27[1] << 8 | puVar27[1] >> 8) * 6.1035156e-05;
                fVar33 = (float)(int)(short)(puVar27[2] << 8 | puVar27[2] >> 8) * 6.1035156e-05;
                puVar27 = puVar27 + 4;
                fVar34 = (float)(int)(short)(*puVar1 << 8 | *puVar1 >> 8) * 6.1035156e-05;
              }
              else {
                fVar35 = 0.0;
                fVar32 = 1.0;
                fVar34 = 1.0;
              }
            }
            else {
              puVar1 = puVar27 + 1;
              fVar32 = (float)(int)(short)(*puVar27 << 8 | *puVar27 >> 8) * 6.1035156e-05;
              puVar27 = puVar27 + 2;
              fVar33 = 0.0;
              fVar35 = 0.0;
              fVar34 = (float)(int)(short)(*puVar1 << 8 | *puVar1 >> 8) * 6.1035156e-05;
            }
          }
          else {
            fVar32 = (float)(int)(short)(*puVar27 << 8 | *puVar27 >> 8) * 6.1035156e-05;
            puVar27 = puVar27 + 1;
            fVar33 = 0.0;
            fVar35 = 0.0;
            fVar34 = fVar32;
          }
          uVar6 = puVar12[1];
          fVar28 = fVar32 * fVar32 + fVar35 * fVar35;
          if (fVar28 < 0.0) {
            fVar28 = sqrtf(fVar28);
          }
          else {
            fVar28 = SQRT(fVar28);
          }
          fVar29 = fVar33 * fVar33 + fVar34 * fVar34;
          if (fVar29 < 0.0) {
            fVar29 = sqrtf(fVar29);
          }
          else {
            fVar29 = SQRT(fVar29);
          }
          uVar9 = stbtt_GetGlyphShape(info,(uint)(ushort)(uVar6 << 8 | uVar6 >> 8),
                                      (stbtt_vertex **)&count_ctx);
          if ((int)uVar9 < 1) {
LAB_0015aa0f:
            bVar5 = true;
            bVar20 = bVar20 & 0x20;
          }
          else {
            lVar18 = 0;
            do {
              sVar21 = *(short *)(count_ctx._0_8_ + lVar18);
              fVar30 = (float)(int)*(short *)(count_ctx._0_8_ + 2 + lVar18);
              *(short *)(count_ctx._0_8_ + lVar18) =
                   (short)(int)((fVar32 * (float)(int)sVar21 + fVar33 * fVar30 + (float)iVar7) *
                               fVar28);
              *(short *)(count_ctx._0_8_ + 2 + lVar18) =
                   (short)(int)(((float)(int)sVar21 * fVar35 + fVar30 * fVar34 + (float)iVar8) *
                               fVar29);
              fVar30 = (float)(int)*(short *)(count_ctx._0_8_ + 4 + lVar18);
              fVar31 = (float)(int)*(short *)(count_ctx._0_8_ + 6 + lVar18);
              *(short *)(count_ctx._0_8_ + 4 + lVar18) =
                   (short)(int)((fVar32 * fVar30 + fVar33 * fVar31 + (float)iVar7) * fVar28);
              *(short *)(count_ctx._0_8_ + 6 + lVar18) =
                   (short)(int)((fVar30 * fVar35 + fVar31 * fVar34 + (float)iVar8) * fVar29);
              lVar18 = lVar18 + 0xe;
            } while ((ulong)uVar9 * 0xe != lVar18);
            psVar13 = (stbtt_vertex *)ImGui::MemAlloc((ulong)(uVar9 + (int)local_d8) * 0xe);
            if (psVar13 != (stbtt_vertex *)0x0) {
              if (0 < (int)local_d8) {
                memcpy(psVar13,vertices,local_d8 * 0xe);
              }
              memcpy(psVar13 + local_d8,(void *)count_ctx._0_8_,(ulong)uVar9 * 0xe);
              if (vertices != (stbtt_vertex *)0x0) {
                ImGui::MemFree(vertices);
              }
              ImGui::MemFree((void *)count_ctx._0_8_);
              local_d8 = (ulong)(uVar9 + (int)local_d8);
              vertices = psVar13;
              goto LAB_0015aa0f;
            }
            if (vertices != (stbtt_vertex *)0x0) {
              ImGui::MemFree(vertices);
            }
            if (count_ctx._0_8_ != 0) {
              ImGui::MemFree((void *)count_ctx._0_8_);
            }
            bVar5 = false;
            bVar20 = bVar22;
          }
          puVar12 = puVar27;
        } while (bVar5);
        if (bVar22 != 0) goto LAB_0015aa73;
      }
      else {
        if ((short)((ushort)puVar4[uVar11] << 8) < 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/include/imstb_truetype.h"
                        ,0x740,
                        "int stbtt__GetGlyphShapeTT(const stbtt_fontinfo *, int, stbtt_vertex **)");
        }
        local_d8._0_4_ = 0;
        vertices = (stbtt_vertex *)0x0;
      }
    }
    else {
      uVar9 = (uint)uVar6 * 2;
      uVar25 = (ulong)uVar9;
      bVar20 = puVar4[uVar25 + uVar11 + 10];
      bVar22 = puVar4[uVar25 + uVar11 + 0xb];
      iVar7 = (uint)puVar4[uVar25 + uVar11 + 8] * 0x100;
      bVar2 = puVar4[uVar25 + uVar11 + 9];
      vertices = (stbtt_vertex *)
                 ImGui::MemAlloc((ulong)((iVar7 + (uint)bVar2 + (uint)uVar6 * 2) * 0xe + 0xe));
      local_d8._0_4_ = 0;
      if (vertices != (stbtt_vertex *)0x0) {
        puVar12 = (ushort *)(puVar4 + (ulong)bVar20 * 0x100 + (ulong)bVar22 + uVar25 + uVar11 + 0xc)
        ;
        uVar14 = (ulong)(iVar7 + (uint)bVar2);
        lVar18 = 0;
        bVar20 = 0;
        bVar22 = 0;
        do {
          if (bVar22 == 0) {
            bVar20 = (byte)*puVar12;
            if ((bVar20 & 8) == 0) {
              puVar12 = (ushort *)((long)puVar12 + 1);
            }
            else {
              bVar22 = *(byte *)((long)puVar12 + 1);
              puVar12 = puVar12 + 1;
            }
          }
          else {
            bVar22 = bVar22 - 1;
          }
          *(byte *)((long)vertices + lVar18 + (ulong)uVar6 * 0x20 + uVar25 * -2 + 0xc) = bVar20;
          lVar18 = lVar18 + 0xe;
        } while ((ulong)((iVar7 + (uint)bVar2 + 1) * 0x10) - (uVar14 * 2 + 2) != lVar18);
        lVar18 = (ulong)(uint)((int)(uVar25 & 0xffff) << 4) + (uVar25 & 0xffff) * -2;
        lVar19 = 0;
        sVar21 = 0;
        do {
          bVar20 = *(byte *)((long)vertices + lVar19 + lVar18 + 0xc);
          if ((bVar20 & 2) == 0) {
            if ((bVar20 & 0x10) == 0) {
              sVar21 = sVar21 + (*puVar12 << 8 | *puVar12 >> 8);
              puVar12 = puVar12 + 1;
            }
          }
          else {
            uVar6 = *puVar12;
            puVar12 = (ushort *)((long)puVar12 + 1);
            uVar23 = -(ushort)(byte)uVar6;
            if ((bVar20 & 0x10) != 0) {
              uVar23 = (ushort)(byte)uVar6;
            }
            sVar21 = sVar21 + uVar23;
          }
          *(short *)((long)vertices + lVar19 + lVar18) = sVar21;
          lVar19 = lVar19 + 0xe;
        } while ((ulong)((iVar7 + (uint)bVar2 + 1) * 0x10) - (uVar14 * 2 + 2) != lVar19);
        lVar19 = (ulong)((uVar9 & 0xffff) << 4) + (ulong)(uVar9 & 0xffff) * -2;
        lVar18 = 0;
        sVar21 = 0;
        do {
          bVar20 = *(byte *)((long)vertices + lVar18 + lVar19 + 0xc);
          if ((bVar20 & 4) == 0) {
            if ((bVar20 & 0x20) == 0) {
              sVar21 = sVar21 + (*puVar12 << 8 | *puVar12 >> 8);
              puVar12 = puVar12 + 1;
            }
          }
          else {
            uVar6 = *puVar12;
            puVar12 = (ushort *)((long)puVar12 + 1);
            uVar23 = -(ushort)(byte)uVar6;
            if ((bVar20 & 0x20) != 0) {
              uVar23 = (ushort)(byte)uVar6;
            }
            sVar21 = sVar21 + uVar23;
          }
          *(short *)((long)vertices + lVar18 + lVar19 + 2) = sVar21;
          lVar18 = lVar18 + 0xe;
        } while ((ulong)((iVar7 + (uint)bVar2 + 1) * 0x10) - (uVar14 * 2 + 2) != lVar18);
        num_vertices = 0;
        iVar8 = 0;
        iVar26 = 0;
        iVar10 = 0;
        sVar24 = 0;
        sVar16 = 0;
        sy = 0;
        sx = 0;
        start_off = 0;
        was_off = 0;
        cx = 0;
        cy = 0;
        do {
          lVar18 = (long)(int)(uVar9 + iVar8);
          bVar20 = vertices[lVar18].type;
          sVar21 = vertices[lVar18].x;
          sVar3 = vertices[lVar18].y;
          cx_00 = (stbtt_int32)sVar21;
          cy_00 = (stbtt_int32)sVar3;
          if (iVar10 == iVar8) {
            if (iVar8 != 0) {
              num_vertices = stbtt__close_shape(vertices,num_vertices,was_off,start_off,sx,sy,sVar16
                                                ,sVar24,cx,cy);
            }
            sx = cx_00;
            sy = cy_00;
            if ((bVar20 & 1) == 0) {
              sVar16 = cx_00;
              sVar24 = cy_00;
              if ((vertices[lVar18 + 1].type & 1) == 0) {
                sx = vertices[lVar18 + 1].x + cx_00 >> 1;
                sy = vertices[lVar18 + 1].y + cy_00 >> 1;
              }
              else {
                iVar8 = iVar8 + 1;
                sx = (int)vertices[lVar18 + 1].x;
                sy = (int)vertices[lVar18 + 1].y;
              }
            }
            start_off = bVar20 & 1 ^ 1;
            vertices[num_vertices].type = '\x01';
            vertices[num_vertices].x = (short)sx;
            vertices[num_vertices].y = (short)sy;
            vertices[num_vertices].cx = 0;
            vertices[num_vertices].cy = 0;
            iVar10 = (ushort)(*(ushort *)(puVar4 + (long)iVar26 * 2 + uVar11 + 10) << 8 |
                             *(ushort *)(puVar4 + (long)iVar26 * 2 + uVar11 + 10) >> 8) + 1;
            iVar26 = iVar26 + 1;
            was_off = 0;
            iVar17 = iVar8;
            num_vertices = num_vertices + 1;
            cx_00 = cx;
            cy_00 = cy;
          }
          else {
            sVar15 = (short)cy;
            iVar17 = iVar8;
            if ((bVar20 & 1) == 0) {
              iVar8 = num_vertices;
              if (was_off != 0) {
                iVar8 = num_vertices + 1;
                vertices[num_vertices].type = '\x03';
                vertices[num_vertices].x = (short)((uint)(cx + cx_00) >> 1);
                vertices[num_vertices].y = (short)((uint)(cy + cy_00) >> 1);
                vertices[num_vertices].cx = (short)cx;
                vertices[num_vertices].cy = sVar15;
              }
              was_off = 1;
              num_vertices = iVar8;
            }
            else {
              psVar13 = vertices + num_vertices;
              if (was_off == 0) {
                psVar13->type = '\x02';
                psVar13->x = sVar21;
                psVar13->y = sVar3;
                psVar13->cx = 0;
                sVar15 = 0;
              }
              else {
                psVar13->type = '\x03';
                psVar13->x = sVar21;
                psVar13->y = sVar3;
                psVar13->cx = (short)cx;
              }
              psVar13->cy = sVar15;
              was_off = 0;
              num_vertices = num_vertices + 1;
              cx_00 = cx;
              cy_00 = cy;
            }
          }
          iVar8 = iVar17 + 1;
          cx = cx_00;
          cy = cy_00;
        } while (iVar17 < (int)(iVar7 + (uint)bVar2));
        local_d8._0_4_ =
             stbtt__close_shape(vertices,num_vertices,was_off,start_off,sx,sy,sVar16,sVar24,cx_00,
                                cy_00);
      }
      if (vertices == (stbtt_vertex *)0x0) {
        return 0;
      }
    }
    *pvertices = vertices;
  }
  return (int)local_d8;
}

Assistant:

STBTT_DEF int stbtt_GetGlyphShape(const stbtt_fontinfo *info, int glyph_index, stbtt_vertex **pvertices)
{
   if (!info->cff.size)
      return stbtt__GetGlyphShapeTT(info, glyph_index, pvertices);
   else
      return stbtt__GetGlyphShapeT2(info, glyph_index, pvertices);
}